

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGShowValidError
               (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidErr err,xmlNodePtr node,xmlNodePtr child,
               xmlChar *arg1,xmlChar *arg2)

{
  xmlChar *pxVar1;
  char *pcVar2;
  xmlChar *pxVar3;
  xmlChar *result;
  char msg [1000];
  xmlChar *local_420;
  char local_418 [999];
  undefined1 local_31;
  
  if ((ctxt->flags & 8) != 0) {
    return;
  }
  pxVar1 = arg1;
  if (arg1 == (xmlChar *)0x0) {
    pxVar1 = "";
  }
  pxVar3 = "";
  if (arg2 != (xmlChar *)0x0) {
    pxVar3 = arg2;
  }
  local_418[0] = '\0';
  switch((ulong)err) {
  case 0:
    pxVar1 = (xmlChar *)0x0;
    goto LAB_00188d97;
  case 1:
    pcVar2 = "out of memory\n";
    goto LAB_00188d89;
  case 2:
    pcVar2 = "failed to validate type %s\n";
    break;
  case 3:
    pcVar2 = "Type %s doesn\'t allow value \'%s\'\n";
    goto LAB_00188c5c;
  case 4:
    pcVar2 = "ID %s redefined\n";
    break;
  case 5:
    pcVar2 = "failed to compare type %s\n";
    break;
  case 6:
    pcVar2 = "Internal error: no state\n";
    goto LAB_00188d89;
  case 7:
    pcVar2 = "Internal error: no define\n";
    goto LAB_00188d89;
  case 8:
    pcVar2 = "Extra data in list: %s\n";
    break;
  default:
    pcVar2 = "Unknown error !\n";
    goto LAB_00188d89;
  case 10:
    pcVar2 = "Internal: interleave block has no data\n";
    goto LAB_00188d89;
  case 0xb:
    pcVar2 = "Invalid sequence in interleave\n";
    goto LAB_00188d89;
  case 0xc:
    pcVar2 = "Extra element %s in interleave\n";
    break;
  case 0xd:
    pcVar2 = "Expecting element %s, got %s\n";
    goto LAB_00188c5c;
  case 0xf:
    pcVar2 = "Expecting a namespace for element %s\n";
    break;
  case 0x11:
    pcVar2 = "Element %s has wrong namespace: expecting %s\n";
    goto LAB_00188c5c;
  case 0x13:
    pcVar2 = "Expecting no namespace for element %s\n";
    break;
  case 0x15:
    pcVar2 = "Expecting element %s to be empty\n";
    break;
  case 0x16:
    pcVar2 = "Expecting an element %s, got nothing\n";
    break;
  case 0x17:
    pcVar2 = "Expecting an element got text\n";
    goto LAB_00188d89;
  case 0x18:
    pcVar2 = "Element %s failed to validate attributes\n";
    break;
  case 0x19:
    pcVar2 = "Element %s failed to validate content\n";
    break;
  case 0x1a:
    pcVar2 = "Element %s has extra content: %s\n";
    goto LAB_00188c5c;
  case 0x1b:
    pcVar2 = "Invalid attribute %s for element %s\n";
LAB_00188c5c:
    snprintf(local_418,1000,pcVar2,pxVar1,pxVar3);
    goto LAB_00188d3a;
  case 0x1c:
    pcVar2 = "Datatype element %s has child elements\n";
    break;
  case 0x1d:
    pcVar2 = "Value element %s has child elements\n";
    break;
  case 0x1e:
    pcVar2 = "List element %s has child elements\n";
    break;
  case 0x1f:
    pcVar2 = "Error validating datatype %s\n";
    break;
  case 0x20:
    pcVar2 = "Error validating value %s\n";
    break;
  case 0x21:
    pcVar2 = "Error validating list\n";
    goto LAB_00188d89;
  case 0x22:
    pcVar2 = "No top grammar defined\n";
    goto LAB_00188d89;
  case 0x23:
    pcVar2 = "Extra data in the document\n";
LAB_00188d89:
    pxVar1 = xmlCharStrdup(pcVar2);
    goto LAB_00188d97;
  case 0x24:
    pcVar2 = "Datatype element %s contains no data\n";
    break;
  case 0x25:
    pcVar2 = "Internal error: %s\n";
    break;
  case 0x26:
    pcVar2 = "Did not expect element %s there\n";
    break;
  case 0x27:
    pcVar2 = "Did not expect text in element %s content\n";
  }
  snprintf(local_418,1000,pcVar2,pxVar1,pxVar3);
LAB_00188d3a:
  if (local_418[0] == '\0') {
    snprintf(local_418,1000,"Unknown error code %d\n",(ulong)err);
  }
  local_31 = 0;
  local_420 = xmlCharStrdup(local_418);
  pxVar1 = xmlEscapeFormatString(&local_420);
LAB_00188d97:
  if (pxVar1 != (xmlChar *)0x0) {
    if (ctxt->errNo == 0) {
      ctxt->errNo = err;
    }
    if (child != (xmlNodePtr)0x0) {
      node = child;
    }
    xmlRngVErr(ctxt,node,err,(char *)pxVar1,arg1,arg2);
    (*xmlFree)(pxVar1);
  }
  return;
}

Assistant:

static void
xmlRelaxNGShowValidError(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidErr err, xmlNodePtr node,
                         xmlNodePtr child, const xmlChar * arg1,
                         const xmlChar * arg2)
{
    xmlChar *msg;

    if (ctxt->flags & FLAGS_NOERROR)
        return;

    msg = xmlRelaxNGGetErrorString(err, arg1, arg2);
    if (msg == NULL)
        return;

    if (ctxt->errNo == XML_RELAXNG_OK)
        ctxt->errNo = err;
    xmlRngVErr(ctxt, (child == NULL ? node : child), err,
               (const char *) msg, arg1, arg2);
    xmlFree(msg);
}